

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operats.c
# Opt level: O3

Vector * Mul_MV(Matrix *M,Vector *V)

{
  size_t *psVar1;
  ElType **ppEVar2;
  Real *pRVar3;
  Real *pRVar4;
  LASErrIdType LVar5;
  ElOrderType EVar6;
  Vector *V_00;
  char *pcVar7;
  size_t sVar8;
  size_t sVar9;
  char *pcVar10;
  char *Object2Name;
  ulong uVar11;
  size_t sVar12;
  size_t sVar13;
  Real *pRVar14;
  ulong uVar15;
  ulong uVar16;
  double dVar17;
  double dVar18;
  
  M_Lock(M);
  V_Lock(V);
  LVar5 = LASResult();
  if (LVar5 != LASOK) {
    V_00 = (Vector *)0x0;
    goto LAB_0010bbd2;
  }
  uVar11 = M->ClmDim;
  if (uVar11 != V->Dim) {
    pcVar7 = M_GetName(M);
    pcVar10 = V_GetName(V);
    V_00 = (Vector *)0x0;
    LASError(LASDimErr,"Mul_MV",pcVar7,pcVar10,(char *)0x0);
    goto LAB_0010bbd2;
  }
  sVar13 = M->RowDim;
  V_00 = (Vector *)malloc(0x30);
  pcVar7 = M_GetName(M);
  sVar8 = strlen(pcVar7);
  pcVar7 = V_GetName(V);
  sVar9 = strlen(pcVar7);
  pcVar7 = (char *)malloc(sVar8 + sVar9 + 10);
  pcVar10 = M_GetName(M);
  Object2Name = V_GetName(V);
  if ((V_00 == (Vector *)0x0) || (pcVar7 == (char *)0x0)) {
    LASError(LASMemAllocErr,"Mul_MV",pcVar10,Object2Name,(char *)0x0);
    if (V_00 != (Vector *)0x0) {
      free(V_00);
    }
    goto LAB_0010bbc3;
  }
  sprintf(pcVar7,"(%s) * (%s)",pcVar10,Object2Name);
  V_Constr(V_00,pcVar7,sVar13,Tempor,True);
  LVar5 = LASResult();
  if (LVar5 == LASOK) {
    psVar1 = M->Len;
    ppEVar2 = M->El;
    pRVar3 = V->Cmp;
    pRVar4 = V_00->Cmp;
    EVar6 = M->ElOrder;
    if (EVar6 == Clmws) {
      V_SetAllCmp(V_00,0.0);
      EVar6 = M->ElOrder;
    }
    dVar17 = M->Multipl * V->Multipl;
    if (EVar6 == Clmws) {
      if (uVar11 != 0) {
        uVar15 = 1;
        uVar16 = -(ulong)(2.220446049250313e-15 <= ABS(dVar17 + -1.0));
        do {
          sVar13 = psVar1[uVar15];
          if (sVar13 != 0) {
            dVar18 = pRVar3[uVar15];
            pRVar14 = &ppEVar2[uVar15]->Val;
            do {
              pRVar4[((ElType *)(pRVar14 + -1))->Pos] =
                   *pRVar14 * (double)((ulong)(dVar17 * dVar18) & uVar16 | ~uVar16 & (ulong)dVar18)
                   + pRVar4[((ElType *)(pRVar14 + -1))->Pos];
              pRVar14 = pRVar14 + 2;
              sVar13 = sVar13 - 1;
            } while (sVar13 != 0);
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 <= uVar11);
        goto LAB_0010bbc3;
      }
    }
    else if ((EVar6 == Rowws) && (sVar13 != 0)) {
      uVar11 = 1;
      uVar15 = -(ulong)(2.220446049250313e-15 <= ABS(dVar17 + -1.0));
      do {
        sVar12 = psVar1[uVar11];
        if (sVar12 == 0) {
          dVar18 = 0.0;
        }
        else {
          pRVar14 = &ppEVar2[uVar11]->Val;
          dVar18 = 0.0;
          do {
            dVar18 = dVar18 + *pRVar14 * pRVar3[((ElType *)(pRVar14 + -1))->Pos];
            pRVar14 = pRVar14 + 2;
            sVar12 = sVar12 - 1;
          } while (sVar12 != 0);
        }
        pRVar4[uVar11] = (Real)(~uVar15 & (ulong)dVar18 | (ulong)(dVar17 * dVar18) & uVar15);
        uVar11 = uVar11 + 1;
      } while (uVar11 <= sVar13);
LAB_0010bbc3:
      if (pcVar7 == (char *)0x0) goto LAB_0010bbd2;
    }
  }
  free(pcVar7);
LAB_0010bbd2:
  M_Unlock(M);
  V_Unlock(V);
  return V_00;
}

Assistant:

Vector *Mul_MV(Matrix *M, Vector *V)
/* VRes = M * V */
{
    Vector *VRes;

    char *VResName;
    double MultiplMV;
    double Sum, Cmp;
    size_t RowDim, ClmDim, Row, Clm, Len, ElCount;
    size_t *MLen;
    Boolean MultiplMVIsOne;
    ElType **MEl, *PtrEl;
    Real *VCmp, *VResCmp;

    M_Lock(M);
    V_Lock(V);
    
    if (LASResult() == LASOK) {
        if (M->ClmDim == V->Dim) {
            RowDim = M->RowDim;
            ClmDim = M->ClmDim;
            VRes = (Vector *)malloc(sizeof(Vector));
            VResName = (char *)malloc((strlen(M_GetName(M)) + strlen(V_GetName(V)) + 10)
                           * sizeof(char));
            if (VRes != NULL && VResName != NULL) {
                sprintf(VResName, "(%s) * (%s)", M_GetName(M), V_GetName(V));
                V_Constr(VRes, VResName, RowDim, Tempor, True);
                if (LASResult() == LASOK) {
                    /* assignment of auxiliary lokal variables */
                    MLen = M->Len;
                    MEl = M->El;
                    VCmp = V->Cmp;
                    VResCmp = VRes->Cmp;

                    /* initialisation of the vector VRes */
                    if (M->ElOrder == Clmws)
                        V_SetAllCmp(VRes, 0.0);

                    /* analysis of multipliers of the matrix M and the vector V */
                    MultiplMV = M->Multipl * V->Multipl;
                    if (IsOne(MultiplMV)) {
                        MultiplMVIsOne = True;
                    } else {
                        MultiplMVIsOne = False;
                    }

                    /* multiplication of matrix elements by vector components */
                    if (M->ElOrder == Rowws) {
                        for (Row = 1; Row <= RowDim; Row++) {
                            Len = MLen[Row];
                            PtrEl = MEl[Row];
                            Sum = 0.0;
                            for (ElCount = Len; ElCount > 0; ElCount--) {
                                Sum += (*PtrEl).Val * VCmp[(*PtrEl).Pos];
                                PtrEl++;
                            }
                            if (MultiplMVIsOne)
                                VResCmp[Row] = Sum;
                            else
                                VResCmp[Row] = MultiplMV * Sum;
                        }
                    }
                    if (M->ElOrder == Clmws) {
                        for (Clm = 1; Clm <= ClmDim; Clm++) {
                            Len = MLen[Clm];
                            PtrEl = MEl[Clm];
                            if (MultiplMVIsOne)
                                   Cmp = VCmp[Clm];
                            else
                                Cmp = MultiplMV * VCmp[Clm];
                            for (ElCount = Len; ElCount > 0; ElCount--) {
                                VResCmp[(*PtrEl).Pos] += (*PtrEl).Val * Cmp;
                                PtrEl++;
                            }
                        }
                    }
                }
            } else {
                LASError(LASMemAllocErr, "Mul_MV", M_GetName(M), V_GetName(V), NULL);
                if (VRes != NULL)
                    free(VRes);
            }
            
            if (VResName != NULL)
                free(VResName);
        } else {
            LASError(LASDimErr, "Mul_MV", M_GetName(M), V_GetName(V), NULL);
            VRes = NULL;
        }
    } else {
        VRes = NULL;
    }

    M_Unlock(M);
    V_Unlock(V);
 
    return(VRes);
}